

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChAssembly.cpp
# Opt level: O2

void __thiscall
chrono::ChAssembly::IntStateGatherReactions(ChAssembly *this,uint off_L,ChVectorDynamic<> *L)

{
  pointer psVar1;
  element_type *peVar2;
  pointer psVar3;
  element_type *peVar4;
  pointer psVar5;
  element_type *peVar6;
  pointer psVar7;
  element_type *peVar8;
  pointer psVar9;
  element_type *peVar10;
  int iVar11;
  int iVar12;
  shared_ptr<chrono::ChBody> *body;
  pointer psVar13;
  pointer psVar14;
  pointer psVar15;
  pointer psVar16;
  pointer psVar17;
  
  iVar12 = off_L - (this->super_ChPhysicsItem).offset_L;
  psVar1 = (this->bodylist).
           super__Vector_base<std::shared_ptr<chrono::ChBody>,_std::allocator<std::shared_ptr<chrono::ChBody>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar13 = (this->bodylist).
                 super__Vector_base<std::shared_ptr<chrono::ChBody>,_std::allocator<std::shared_ptr<chrono::ChBody>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; psVar13 != psVar1; psVar13 = psVar13 + 1
      ) {
    iVar11 = (*(((psVar13->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
               super_ChPhysicsItem).super_ChObj._vptr_ChObj[9])();
    if ((char)iVar11 != '\0') {
      peVar2 = (psVar13->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      (*(peVar2->super_ChPhysicsItem).super_ChObj._vptr_ChObj[0x1f])
                (peVar2,(ulong)((peVar2->super_ChPhysicsItem).offset_L + iVar12),L);
    }
  }
  psVar3 = (this->shaftlist).
           super__Vector_base<std::shared_ptr<chrono::ChShaft>,_std::allocator<std::shared_ptr<chrono::ChShaft>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar14 = (this->shaftlist).
                 super__Vector_base<std::shared_ptr<chrono::ChShaft>,_std::allocator<std::shared_ptr<chrono::ChShaft>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; psVar14 != psVar3; psVar14 = psVar14 + 1
      ) {
    iVar11 = (*(((psVar14->super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
               ->super_ChPhysicsItem).super_ChObj._vptr_ChObj[9])();
    if ((char)iVar11 != '\0') {
      peVar4 = (psVar14->super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      (*(peVar4->super_ChPhysicsItem).super_ChObj._vptr_ChObj[0x1f])
                (peVar4,(ulong)((peVar4->super_ChPhysicsItem).offset_L + iVar12),L);
    }
  }
  psVar5 = (this->linklist).
           super__Vector_base<std::shared_ptr<chrono::ChLinkBase>,_std::allocator<std::shared_ptr<chrono::ChLinkBase>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar15 = (this->linklist).
                 super__Vector_base<std::shared_ptr<chrono::ChLinkBase>,_std::allocator<std::shared_ptr<chrono::ChLinkBase>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; psVar15 != psVar5; psVar15 = psVar15 + 1
      ) {
    iVar11 = (*(((psVar15->super___shared_ptr<chrono::ChLinkBase,_(__gnu_cxx::_Lock_policy)2>).
                _M_ptr)->super_ChPhysicsItem).super_ChObj._vptr_ChObj[9])();
    if ((char)iVar11 != '\0') {
      peVar6 = (psVar15->super___shared_ptr<chrono::ChLinkBase,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      (*(peVar6->super_ChPhysicsItem).super_ChObj._vptr_ChObj[0x1f])
                (peVar6,(ulong)((peVar6->super_ChPhysicsItem).offset_L + iVar12),L);
    }
  }
  psVar7 = (this->meshlist).
           super__Vector_base<std::shared_ptr<chrono::fea::ChMesh>,_std::allocator<std::shared_ptr<chrono::fea::ChMesh>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar16 = (this->meshlist).
                 super__Vector_base<std::shared_ptr<chrono::fea::ChMesh>,_std::allocator<std::shared_ptr<chrono::fea::ChMesh>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; psVar16 != psVar7; psVar16 = psVar16 + 1
      ) {
    peVar8 = (psVar16->super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    (*(peVar8->super_ChIndexedNodes).super_ChPhysicsItem.super_ChObj._vptr_ChObj[0x1f])
              (peVar8,(ulong)((peVar8->super_ChIndexedNodes).super_ChPhysicsItem.offset_L + iVar12),
               L);
  }
  psVar9 = (this->otherphysicslist).
           super__Vector_base<std::shared_ptr<chrono::ChPhysicsItem>,_std::allocator<std::shared_ptr<chrono::ChPhysicsItem>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar17 = (this->otherphysicslist).
                 super__Vector_base<std::shared_ptr<chrono::ChPhysicsItem>,_std::allocator<std::shared_ptr<chrono::ChPhysicsItem>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; psVar17 != psVar9; psVar17 = psVar17 + 1
      ) {
    iVar11 = (*(((psVar17->super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>).
                _M_ptr)->super_ChObj)._vptr_ChObj[9])();
    if ((char)iVar11 != '\0') {
      peVar10 = (psVar17->super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>).
                _M_ptr;
      (*(peVar10->super_ChObj)._vptr_ChObj[0x1f])(peVar10,(ulong)(peVar10->offset_L + iVar12),L);
    }
  }
  return;
}

Assistant:

void ChAssembly::IntStateGatherReactions(const unsigned int off_L, ChVectorDynamic<>& L) {
    unsigned int displ_L = off_L - this->offset_L;

    for (auto& body : bodylist) {
        if (body->IsActive())
            body->IntStateGatherReactions(displ_L + body->GetOffset_L(), L);
    }
    for (auto& shaft : shaftlist) {
        if (shaft->IsActive())
            shaft->IntStateGatherReactions(displ_L + shaft->GetOffset_L(), L);
    }
    for (auto& link : linklist) {
        if (link->IsActive())
            link->IntStateGatherReactions(displ_L + link->GetOffset_L(), L);
    }
    for (auto& mesh : meshlist) {
        mesh->IntStateGatherReactions(displ_L + mesh->GetOffset_L(), L);
    }
    for (auto& item : otherphysicslist) {
        if (item->IsActive())
            item->IntStateGatherReactions(displ_L + item->GetOffset_L(), L);
    }
}